

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.h
# Opt level: O0

bool Js::PropertyRecordStringHashComparer<Js::HashedCharacterBuffer<char16_t>_*>::Equals
               (HashedCharacterBuffer<char16_t> *str1,HashedCharacterBuffer<char16_t> *str2)

{
  charcount_t cVar1;
  charcount_t cVar2;
  hash_t hVar3;
  hash_t hVar4;
  char16_t *s1;
  char16_t *s2;
  undefined1 local_19;
  HashedCharacterBuffer<char16_t> *str2_local;
  HashedCharacterBuffer<char16_t> *str1_local;
  
  cVar1 = JsUtil::CharacterBuffer<char16_t>::GetLength(&str1->super_CharacterBuffer<char16_t>);
  cVar2 = JsUtil::CharacterBuffer<char16_t>::GetLength(&str2->super_CharacterBuffer<char16_t>);
  local_19 = false;
  if (cVar1 == cVar2) {
    hVar3 = HashedCharacterBuffer<char16_t>::GetHashCode(str1);
    hVar4 = HashedCharacterBuffer<char16_t>::GetHashCode(str2);
    local_19 = false;
    if (hVar3 == hVar4) {
      s1 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(&str1->super_CharacterBuffer<char16_t>);
      s2 = JsUtil::CharacterBuffer<char16_t>::GetBuffer(&str2->super_CharacterBuffer<char16_t>);
      cVar1 = JsUtil::CharacterBuffer<char16_t>::GetLength(&str1->super_CharacterBuffer<char16_t>);
      local_19 = JsUtil::CharacterBuffer<char16_t>::StaticEquals(s1,s2,cVar1);
    }
  }
  return local_19;
}

Assistant:

inline static bool Equals(HashedCharacterBuffer<char16>* const str1, HashedCharacterBuffer<char16>* const str2)
        {
            return (str1->GetLength() == str2->GetLength() &&
                str1->GetHashCode() == str2->GetHashCode() &&
                JsUtil::CharacterBuffer<char16>::StaticEquals(str1->GetBuffer(), str2->GetBuffer(), str1->GetLength()));
        }